

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ProgramSharingTest::renderResource
          (GLES2ProgramSharingTest *this,Surface *screen,Surface *reference)

{
  glUseProgramFunc p_Var1;
  glGetAttribLocationFunc p_Var2;
  glReadPixelsFunc p_Var3;
  Surface *this_00;
  GLenum GVar4;
  deBool dVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  TestError *pTVar11;
  void *pvVar12;
  float *pfVar13;
  float s_00;
  float s_01;
  RGBA local_1c8;
  int local_1c4;
  int local_1c0;
  int alpha;
  int blue;
  int green;
  int red;
  Vector<float,_4> local_1a4;
  Vector<float,_4> local_194;
  Vector<float,_4> local_184;
  tcu local_174 [8];
  float local_16c [2];
  Vector<float,_4> local_164;
  Vector<float,_4> local_154;
  Vector<float,_4> local_144;
  Vector<float,_4> local_134;
  tcu local_124 [8];
  float local_11c [2];
  undefined1 local_114 [8];
  Vec4 color;
  Vec4 d;
  Vec4 c;
  Vec4 b;
  Vec4 a;
  bool isUpper;
  float s;
  float t;
  int y;
  int x;
  int y2;
  int y1;
  int x2;
  int x1;
  PixelBufferAccess local_90;
  PixelBufferAccess local_68;
  GLuint local_40;
  GLuint colorLocation;
  GLuint local_2c;
  GLsizei local_28;
  GLuint coordLocation;
  int height;
  int width;
  Surface *reference_local;
  Surface *screen_local;
  GLES2ProgramSharingTest *this_local;
  
  coordLocation = 0xf0;
  local_28 = 0xf0;
  _height = reference;
  reference_local = screen;
  screen_local = (Surface *)this;
  if (screen != (Surface *)0x0) {
    coordLocation = tcu::Surface::getWidth(screen);
    local_28 = tcu::Surface::getHeight(reference_local);
  }
  do {
    (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,coordLocation,local_28);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"viewport(0, 0, width, height)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x2c8);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x2ca);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x2cb);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    p_Var1 = (this->super_GLES2SharingTest).m_gl.useProgram;
    dVar6 = glu::ShaderProgram::getProgram(this->m_program);
    (*p_Var1)(dVar6);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"useProgram(m_program->getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x2cd);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  p_Var2 = (this->super_GLES2SharingTest).m_gl.getAttribLocation;
  dVar6 = glu::ShaderProgram::getProgram(this->m_program);
  local_2c = (*p_Var2)(dVar6,"a_pos");
  GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar4,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2d0);
  while ((dVar5 = ::deGetFalse(), dVar5 == 0 && (local_2c != 0xffffffff))) {
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      p_Var2 = (this->super_GLES2SharingTest).m_gl.getAttribLocation;
      dVar6 = glu::ShaderProgram::getProgram(this->m_program);
      local_40 = (*p_Var2)(dVar6,"a_color");
      GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar4,"glGetAttribLocation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2d4);
      while ((dVar5 = ::deGetFalse(), dVar5 == 0 && (local_40 != 0xffffffff))) {
        dVar5 = ::deGetFalse();
        if (dVar5 == 0) {
          do {
            (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(local_40);
            GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar4,"enableVertexAttribArray(colorLocation)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x2d7);
            dVar5 = ::deGetFalse();
          } while (dVar5 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(local_2c);
            GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar4,"enableVertexAttribArray(coordLocation)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x2d8);
            dVar5 = ::deGetFalse();
          } while (dVar5 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                      (local_40,4,0x1406,'\0',0,renderResource::colors);
            GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar4,
                            "vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x2da);
            dVar5 = ::deGetFalse();
          } while (dVar5 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                      (local_2c,2,0x1406,'\0',0,renderResource::coords);
            GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar4,
                            "vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x2db);
            dVar5 = ::deGetFalse();
          } while (dVar5 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.drawElements)(4,6,0x1403,renderResource::indices);
            GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar4,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x2dd);
            dVar5 = ::deGetFalse();
          } while (dVar5 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(local_2c);
            GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar4,"disableVertexAttribArray(coordLocation)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x2de);
            dVar5 = ::deGetFalse();
          } while (dVar5 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(local_40);
            GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar4,"disableVertexAttribArray(colorLocation)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x2df);
            dVar5 = ::deGetFalse();
          } while (dVar5 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
            GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar4,"useProgram(0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x2e0);
            dVar5 = ::deGetFalse();
          } while (dVar5 != 0);
          if (reference_local != (Surface *)0x0) {
            p_Var3 = (this->super_GLES2SharingTest).m_gl.readPixels;
            iVar7 = tcu::Surface::getWidth(reference_local);
            iVar8 = tcu::Surface::getHeight(reference_local);
            tcu::Surface::getAccess(&local_68,reference_local);
            pvVar12 = tcu::PixelBufferAccess::getDataPtr(&local_68);
            (*p_Var3)(0,0,iVar7,iVar8,0x1908,0x1401,pvVar12);
            tcu::Surface::getAccess(&local_90,_height);
            tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&x2,0xff,0,0,0xff);
            tcu::clear(&local_90,(IVec4 *)&x2);
            iVar7 = (int)(((float)(int)coordLocation / 2.0) * 0.9 + (float)(int)coordLocation / 2.0)
            ;
            fVar10 = (float)(int)(((float)local_28 / 2.0) * -0.9 + (float)local_28 / 2.0);
            iVar8 = (int)(((float)local_28 / 2.0) * 0.9 + (float)local_28 / 2.0);
            fVar9 = (float)(int)(((float)(int)coordLocation / 2.0) * -0.9 +
                                (float)(int)coordLocation / 2.0);
            for (t = fVar9; s = fVar10, (int)t <= iVar7; t = (float)((int)t + 1)) {
              for (; (int)s <= iVar8; s = (float)((int)s + 1)) {
                s_00 = (float)((int)t - (int)fVar9) / (float)(iVar7 - (int)fVar9);
                s_01 = (float)((int)s - (int)fVar10) / (float)(iVar8 - (int)fVar10);
                tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(b.m_data + 2),0.0,0.0,0.0,1.0);
                tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(c.m_data + 2),1.0,0.0,0.0,1.0);
                tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(d.m_data + 2),0.0,1.0,0.0,1.0);
                tcu::Vector<float,_4>::Vector
                          ((Vector<float,_4> *)(color.m_data + 2),0.0,0.0,1.0,1.0);
                tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_114);
                if (s_00 <= s_01) {
                  tcu::operator*((tcu *)&local_194,(Vector<float,_4> *)(b.m_data + 2),1.0 - s_01);
                  tcu::operator*((tcu *)&local_1a4,(Vector<float,_4> *)(color.m_data + 2),
                                 s_01 - s_00);
                  tcu::operator+((tcu *)&local_184,&local_194,&local_1a4);
                  tcu::operator*((tcu *)&green,s_00,(Vector<float,_4> *)(d.m_data + 2));
                  tcu::operator+(local_174,&local_184,(Vector<float,_4> *)&green);
                  local_114[0] = local_174[0];
                  local_114[1] = local_174[1];
                  local_114[2] = local_174[2];
                  local_114[3] = local_174[3];
                  local_114[4] = local_174[4];
                  local_114[5] = local_174[5];
                  local_114[6] = local_174[6];
                  local_114[7] = local_174[7];
                  color.m_data[0] = local_16c[0];
                  color.m_data[1] = local_16c[1];
                }
                else {
                  tcu::operator*((tcu *)&local_144,(Vector<float,_4> *)(b.m_data + 2),1.0 - s_00);
                  tcu::operator*((tcu *)&local_154,(Vector<float,_4> *)(c.m_data + 2),s_00 - s_01);
                  tcu::operator+((tcu *)&local_134,&local_144,&local_154);
                  tcu::operator*((tcu *)&local_164,s_01,(Vector<float,_4> *)(d.m_data + 2));
                  tcu::operator+(local_124,&local_134,&local_164);
                  local_114[0] = local_124[0];
                  local_114[1] = local_124[1];
                  local_114[2] = local_124[2];
                  local_114[3] = local_124[3];
                  local_114[4] = local_124[4];
                  local_114[5] = local_124[5];
                  local_114[6] = local_124[6];
                  local_114[7] = local_124[7];
                  color.m_data[0] = local_11c[0];
                  color.m_data[1] = local_11c[1];
                }
                pfVar13 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_114);
                blue = ::deClamp32((int)(*pfVar13 * 255.0),0,0xff);
                pfVar13 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_114);
                alpha = ::deClamp32((int)(*pfVar13 * 255.0),0,0xff);
                pfVar13 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_114);
                local_1c0 = ::deClamp32((int)(*pfVar13 * 255.0),0,0xff);
                pfVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_114);
                local_1c4 = ::deClamp32((int)(*pfVar13 * 255.0),0,0xff);
                this_00 = _height;
                tcu::RGBA::RGBA(&local_1c8,blue,alpha,local_1c0,local_1c4);
                tcu::Surface::setPixel(this_00,(int)t,(int)s,local_1c8);
              }
            }
          }
          return;
        }
      }
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,(char *)0x0,"colorLocation != (GLuint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                 ,0x2d5);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar11,(char *)0x0,"coordLocation != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x2d1);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GLES2ProgramSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-0.9f, -0.9f,
		 0.9f, -0.9f,
		 0.9f,  0.9f,
		-0.9f,  0.9f
	};

	static const GLfloat colors [] = {
		0.0f, 0.0f, 0.0f, 1.0f,
		1.0f, 0.0f, 0.0f, 1.0f,
		0.0f, 1.0f, 0.0f, 1.0f,
		0.0f, 0.0f, 1.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(m_program->getProgram()));

	GLuint coordLocation = m_gl.getAttribLocation(m_program->getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(m_program->getProgram(), "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));

		int x1 = (int)(((float)width/2.0f)  * (-0.9f) + ((float)width/2.0f));
		int x2 = (int)(((float)width/2.0f)  *   0.9f  + ((float)width/2.0f));
		int y1 = (int)(((float)height/2.0f) * (-0.9f) + ((float)height/2.0f));
		int y2 = (int)(((float)height/2.0f) *   0.9f  + ((float)height/2.0f));

		for (int x = x1; x <= x2; x++)
		{
			for (int y = y1; y <= y2; y++)
			{
				float t = ((float)(x-x1) / (float)(x2-x1));
				float s = ((float)(y-y1) / (float)(y2-y1));
				bool isUpper = t > s;

				tcu::Vec4 a(colors[0],		colors[1],		colors[2],		colors[3]);
				tcu::Vec4 b(colors[4 + 0],	colors[4 + 1],	colors[4 + 2],	colors[4 + 3]);
				tcu::Vec4 c(colors[8 + 0],	colors[8 + 1],	colors[8 + 2],	colors[8 + 3]);
				tcu::Vec4 d(colors[12 + 0],	colors[12 + 1],	colors[12 + 2],	colors[12 + 3]);


				tcu::Vec4 color;

				if (isUpper)
					color = a * (1.0f - t)  + b * (t - s) + s * c;
				else
					color = a * (1.0f - s)  + d * (s - t) + t * c;

				int red		= deClamp32((int)(255.0f * color.x()), 0, 255);
				int green	= deClamp32((int)(255.0f * color.y()), 0, 255);
				int blue	= deClamp32((int)(255.0f * color.z()), 0, 255);
				int alpha	= deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(red, green, blue, alpha));
			}
		}
	}
}